

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBox2dShape.cpp
# Opt level: O2

void __thiscall
cbtBox2dShape::getAabb(cbtBox2dShape *this,cbtTransform *t,cbtVector3 *aabbMin,cbtVector3 *aabbMax)

{
  cbtScalar margin;
  
  (*(this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.super_cbtConvexShape.
    super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])();
  cbtTransformAabb(&(this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.
                    m_implicitShapeDimensions,margin,t,aabbMin,aabbMax);
  return;
}

Assistant:

void cbtBox2dShape::getAabb(const cbtTransform& t, cbtVector3& aabbMin, cbtVector3& aabbMax) const
{
	cbtTransformAabb(getHalfExtentsWithoutMargin(), getMargin(), t, aabbMin, aabbMax);
}